

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_> * __thiscall
Catch::Generators::
makeGenerators<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>
          (Generators<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>
           *__return_storage_ptr__,Generators *this,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *val,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *moreGenerators,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *moreGenerators_1,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *moreGenerators_2)

{
  long *local_30;
  
  value<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>
            ((Generators *)&local_30,
             (unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *)this);
  Generators<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>::
  Generators<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>
            ((Generators<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>> *)
             __return_storage_ptr__,
             (GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_> *)
             &local_30,val,moreGenerators,moreGenerators_1);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }